

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O2

void __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::increment(merge_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
            *this)

{
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  __last;
  int iVar1;
  compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  unaff_EBX;
  compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  in_stack_00000008;
  
  std::
  pop_heap<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
            ((this->m_begin)._M_current,(this->m_end)._M_current,unaff_EBX);
  __last._M_current = (this->m_end)._M_current;
  iVar1 = __last._M_current[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.m_value + 1;
  __last._M_current[-1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_value = iVar1;
  if (iVar1 == __last._M_current[-1].
               super_iterator_range<boost::range_detail::integer_iterator<int>_>.
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_value) {
    (this->m_end)._M_current = __last._M_current + -1;
    return;
  }
  std::
  push_heap<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
            ((this->m_begin)._M_current,__last,in_stack_00000008);
  return;
}

Assistant:

void increment ()
        {
            std::pop_heap(m_begin, m_end, each(front) | invert(m_compare));
            auto & range = *std::prev(m_end);

            range.advance_begin(1);
            if (not range.empty())
            {
                std::push_heap(m_begin, m_end, each(front) | invert(m_compare));
            }
            else
            {
                --m_end;
            }
        }